

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_ibs.c
# Opt level: O2

err_t bignIdSign(octet *id_sig,bign_params *params,octet *oid_der,size_t oid_len,octet *id_hash,
                octet *hash,octet *id_privkey,gen_i rng,void *rng_state)

{
  word *a;
  word *b;
  ulong count;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec;
  ulong hash_len;
  word wVar5;
  ulong n;
  u64 *dest;
  word *stack;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(params);
    if (bVar1 == 0) {
      eVar2 = 0x1f6;
    }
    else {
      eVar2 = 0x12d;
      if ((oid_len != 0xffffffffffffffff) &&
         (sVar4 = oidFromDER((char *)0x0,oid_der,oid_len), sVar4 != 0xffffffffffffffff)) {
        if (rng == (gen_i)0x0) {
          eVar2 = 0x130;
        }
        else {
          sVar4 = bignStart_keep(params->l,bignIdSign_deep);
          ec = (ec_o *)blobCreate(sVar4);
          if (ec == (ec_o *)0x0) {
            eVar2 = 0x6e;
          }
          else {
            eVar2 = bignStart(ec,params);
            if (eVar2 == 0) {
              sVar4 = ec->f->n;
              count = ec->f->no;
              bVar1 = memIsValid(id_hash,count);
              eVar2 = 0x6d;
              if (((bVar1 != 0) && (bVar1 = memIsValid(hash,count), bVar1 != 0)) &&
                 (bVar1 = memIsValid(id_privkey,count), bVar1 != 0)) {
                hash_len = count >> 1;
                bVar1 = memIsValid(id_sig,hash_len + count);
                if (bVar1 != 0) {
                  dest = (u64 *)((long)&(ec->hdr).keep + (ec->hdr).keep);
                  u64From(dest,id_privkey,count);
                  iVar3 = wwCmp(dest,ec->order,sVar4);
                  eVar2 = 0x1f8;
                  if (iVar3 < 0) {
                    a = dest + sVar4;
                    bVar1 = zzRandNZMod(a,ec->order,sVar4,rng,rng_state);
                    if (bVar1 == 0) {
                      eVar2 = 0x130;
                    }
                    else {
                      b = a + sVar4;
                      stack = b + sVar4 * 2;
                      bVar1 = ecMulA(b,ec->base,ec,a,sVar4,stack);
                      if (bVar1 == 0) {
                        eVar2 = 0x1f6;
                      }
                      else {
                        n = sVar4 >> 1;
                        (*ec->f->to)((octet *)b,b,ec->f,stack);
                        beltHashStart(stack);
                        beltHashStepH(oid_der,oid_len,stack);
                        beltHashStepH(b,count,stack);
                        beltHashStepH(id_hash,count,stack);
                        beltHashStepH(hash,count,stack);
                        beltHashStepG2(id_sig,hash_len,stack);
                        u64From(b + sVar4 + n,id_sig,hash_len);
                        zzMul(b,b + sVar4 + n,n,dest,sVar4,stack);
                        wVar5 = zzAdd(b + n,b + n,dest,sVar4);
                        b[sVar4 + n] = wVar5;
                        zzMod(dest,b,n + 1 + sVar4,ec->order,sVar4,stack);
                        zzSubMod(dest,a,dest,ec->order,sVar4);
                        u64From(a,hash,count);
                        zzSubMod(dest,dest,a,ec->order,sVar4);
                        u64To(id_sig + hash_len,count,dest);
                        eVar2 = 0;
                      }
                    }
                  }
                }
              }
            }
            blobClose(ec);
          }
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bignIdSign(octet id_sig[], const bign_params* params, 
	const octet oid_der[], size_t oid_len, const octet id_hash[], 
	const octet hash[], const octet id_privkey[], gen_i rng, void* rng_state)
{
	err_t code;
	size_t no, n;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* e;				/* [n] личный ключ */
	word* k;				/* [n] одноразовый личный ключ */
	word* V;				/* [2n] точка V */
	word* s0;				/* [n/2] первая часть подписи */
	word* s1;				/* [n] вторая часть подписи */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len)  == SIZE_MAX)
		return ERR_BAD_OID;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignIdSign_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	ASSERT(n % 2 == 0);
	// проверить входные указатели
	if (!memIsValid(id_hash, no) ||
		!memIsValid(hash, no) ||
		!memIsValid(id_privkey, no) ||
		!memIsValid(id_sig, no + no / 2))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	e = s1 = objEnd(ec, word);
	k = e + n;
	V = k + n;
	s0 = V + n + n / 2;
	stack = (octet*)(V + 2 * n);
	// загрузить e
	wwFrom(e, id_privkey, no);
	if (wwCmp(e, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// сгенерировать k с помощью rng
	if (!zzRandNZMod(k, ec->order, n, rng, rng_state))
	{
		blobClose(state);
		return ERR_BAD_RNG;
	}
	// V <- k G
	if (!ecMulA(V, ec->base, ec, k, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	qrTo((octet*)V, ecX(V), ec->f, stack);
	// s0 <- belt-hash(oid || V || H0 || H) mod 2^l
	beltHashStart(stack);
	beltHashStepH(oid_der, oid_len, stack);
	beltHashStepH(V, no, stack);
	beltHashStepH(id_hash, no, stack);
	beltHashStepH(hash, no, stack);
	beltHashStepG2(id_sig, no / 2, stack);
	wwFrom(s0, id_sig, no / 2);
	// V <- (s0 + 2^l) e
	zzMul(V, s0, n / 2, e, n, stack);
	V[n + n / 2] = zzAdd(V + n / 2, V + n / 2, e, n);
	// s1 <- V mod q
	zzMod(s1, V, n + n / 2 + 1, ec->order, n, stack);
	// s1 <- (k - s1 - H) mod q
	zzSubMod(s1, k, s1, ec->order, n);
	wwFrom(k, hash, no);
	zzSubMod(s1, s1, k, ec->order, n);
	// выгрузить s1
	wwTo(id_sig + no / 2, no, s1);
	// все нормально
	blobClose(state);
	return ERR_OK;
}